

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

char * strrpl(char *str,size_t n,char oldchar,char newchar)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  
  pcVar1 = (char *)calloc(n + 1,1);
  if (n != 0 && pcVar1 != (char *)0x0) {
    sVar2 = 0;
    do {
      cVar3 = str[sVar2];
      if (cVar3 == '\\') {
        cVar3 = '/';
      }
      else if (cVar3 == '\0') {
        return pcVar1;
      }
      pcVar1[sVar2] = cVar3;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  return pcVar1;
}

Assistant:

static char *strrpl(const char *str, size_t n, char oldchar, char newchar) {
  char c;
  size_t i;
  char *rpl = (char *)calloc((1 + n), sizeof(char));
  char *begin = rpl;
  if (!rpl) {
    return NULL;
  }

  for (i = 0; (i < n) && (c = *str++); ++i) {
    if (c == oldchar) {
      c = newchar;
    }
    *rpl++ = c;
  }

  return begin;
}